

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatType.cpp
# Opt level: O0

void __thiscall hdc::FloatType::FloatType(FloatType *this,Token *token)

{
  Token *token_local;
  FloatType *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_002203b8;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_FLOAT_TYPE;
  return;
}

Assistant:

FloatType::FloatType(Token& token) {
    this->token = token;
    this->kind = AST_FLOAT_TYPE;
}